

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O3

int32 ** parse_subvecs(char *str)

{
  uint uVar1;
  uint uVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  glist_t pgVar7;
  int32 **ppiVar8;
  int32 *piVar9;
  gnode_s *pgVar10;
  long lVar11;
  glist_t pgVar12;
  char *pcVar13;
  long lVar14;
  bool bVar15;
  int32 l;
  uint local_50;
  uint local_4c;
  char *local_48;
  int local_3c;
  glist_t local_38;
  
  iVar6 = __isoc99_sscanf(str,"%d%n",&local_50,&local_3c);
  local_48 = str;
  if (iVar6 == 1) {
    local_38 = (glist_t)0x0;
    do {
      pgVar7 = (glist_t)0x0;
      while( true ) {
        pcVar13 = str + local_3c;
        if (str[local_3c] == '-') {
          pcVar13 = pcVar13 + 1;
          iVar6 = __isoc99_sscanf(pcVar13,"%d%n",&local_4c,&local_3c);
          if (iVar6 != 1) {
            lVar14 = (long)pcVar13 - (long)local_48;
            pcVar13 = "\'%s\': Couldn\'t read int32 @pos %d\n";
            lVar11 = 0xc3;
            goto LAB_0011f658;
          }
          pcVar13 = pcVar13 + local_3c;
        }
        else {
          local_4c = local_50;
        }
        if (((int)local_50 < 0) || ((int)local_4c < (int)local_50)) {
          lVar14 = (long)pcVar13 - (long)local_48;
          pcVar13 = "\'%s\': Bad subrange spec ending @pos %d\n";
          lVar11 = 0xcb;
          goto LAB_0011f658;
        }
        do {
          if (pgVar7 != (glist_t)0x0) {
            pgVar10 = pgVar7;
            do {
              if ((pgVar10->data).ptr == (void *)(long)(int)local_50) {
                lVar14 = (long)pcVar13 - (long)local_48;
                pcVar13 = "\'%s\': Duplicate dimension ending @pos %d\n";
                lVar11 = 0xd4;
                goto LAB_0011f658;
              }
              pgVar10 = pgVar10->next;
            } while (pgVar10 != (gnode_s *)0x0);
          }
          pgVar7 = glist_add_int32(pgVar7,local_50);
          uVar1 = local_50 + 1;
          bVar4 = (int)local_50 < (int)local_4c;
          local_50 = uVar1;
        } while (bVar4);
        cVar3 = *pcVar13;
        if (cVar3 != ',') break;
        str = pcVar13 + 1;
        iVar6 = __isoc99_sscanf(str,"%d%n",&local_50,&local_3c);
        if (iVar6 != 1) goto LAB_0011f4bc;
      }
      if ((cVar3 != '\0') && (cVar3 != '/')) {
        lVar14 = (long)pcVar13 - (long)local_48;
        pcVar13 = "\'%s\': Bad delimiter @pos %d\n";
        lVar11 = 0xdd;
        goto LAB_0011f658;
      }
      pgVar7 = glist_add_ptr(local_38,pgVar7);
      local_38 = pgVar7;
      if (*pcVar13 != '/') {
        if (*pcVar13 != '\0') {
          __assert_fail("*strp == \'/\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                        ,0xe7,"int32 **parse_subvecs(const char *)");
        }
        local_50 = glist_count(pgVar7);
        ppiVar8 = (int32 **)
                  __ckd_calloc__((long)(int)(local_50 + 1),8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                 ,0xed);
        lVar11 = (long)(int)local_50;
        local_50 = local_50 - 1;
        bVar15 = pgVar7 != (glist_t)0x0;
        ppiVar8[lVar11] = (int32 *)0x0;
        bVar4 = 0 < lVar11;
        pgVar10 = pgVar7;
        if (0 < lVar11) goto joined_r0x0011f53c;
        goto LAB_0011f5fa;
      }
      str = pcVar13 + 1;
      iVar6 = __isoc99_sscanf(str,"%d%n",&local_50,&local_3c);
    } while (iVar6 == 1);
  }
LAB_0011f4bc:
  lVar14 = (long)str - (long)local_48;
  pcVar13 = "\'%s\': Couldn\'t read int32 @pos %d\n";
  lVar11 = 0xbb;
LAB_0011f658:
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
          ,lVar11,pcVar13,local_48,lVar14);
LAB_0011f667:
  exit(1);
  while( true ) {
    pgVar12 = (glist_t)(pgVar10->data).ptr;
    local_4c = glist_count(pgVar12);
    if ((int)local_4c < 1) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
              ,0xf5,"\'%s\': 0-length subvector\n",local_48);
      goto LAB_0011f667;
    }
    piVar9 = (int32 *)__ckd_calloc__((ulong)(local_4c + 1),4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                     ,0xf7);
    ppiVar8[(int)local_50] = piVar9;
    piVar9[(int)local_4c] = -1;
    while( true ) {
      uVar1 = local_4c - 1;
      if (((int)local_4c < 1) || (pgVar12 == (glist_t)0x0)) break;
      ppiVar8[(int)local_50][uVar1] = *(int32 *)&pgVar12->data;
      pgVar12 = pgVar12->next;
      local_4c = uVar1;
    }
    if ((0 < (int)local_4c) || (pgVar12 != (glist_t)0x0)) {
      local_4c = uVar1;
      __assert_fail("(n2 < 0) && (!gn2)",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                    ,0xfc,"int32 **parse_subvecs(const char *)");
    }
    pgVar10 = pgVar10->next;
    uVar2 = local_50 - 1;
    bVar15 = pgVar10 != (gnode_s *)0x0;
    bVar4 = 0 < (int)local_50;
    bVar5 = (int)local_50 < 1;
    local_50 = uVar2;
    local_4c = uVar1;
    if (bVar5) break;
joined_r0x0011f53c:
    if (pgVar10 == (glist_t)0x0) break;
  }
LAB_0011f5fa:
  if ((!bVar4) && (pgVar12 = pgVar7, !bVar15)) {
    for (; pgVar12 != (glist_t)0x0; pgVar12 = pgVar12->next) {
      glist_free((glist_t)(pgVar12->data).ptr);
    }
    glist_free(pgVar7);
    return ppiVar8;
  }
  __assert_fail("(n < 0) && (!gn)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                ,0xfe,"int32 **parse_subvecs(const char *)");
}

Assistant:

int32 **
parse_subvecs(char const *str)
{
    char const *strp;
    int32 n, n2, l;
    glist_t dimlist;            /* List of dimensions in one subvector */
    glist_t veclist;            /* List of dimlists (subvectors) */
    int32 **subvec;
    gnode_t *gn, *gn2;

    veclist = NULL;

    strp = str;
    for (;;) {
        dimlist = NULL;

        for (;;) {
            if (sscanf(strp, "%d%n", &n, &l) != 1)
                E_FATAL("'%s': Couldn't read int32 @pos %d\n", str,
                        strp - str);
            strp += l;

            if (*strp == '-') {
                strp++;

                if (sscanf(strp, "%d%n", &n2, &l) != 1)
                    E_FATAL("'%s': Couldn't read int32 @pos %d\n", str,
                            strp - str);
                strp += l;
            }
            else
                n2 = n;

            if ((n < 0) || (n > n2))
                E_FATAL("'%s': Bad subrange spec ending @pos %d\n", str,
                        strp - str);

            for (; n <= n2; n++) {
		gnode_t *gn;
		for (gn = dimlist; gn; gn = gnode_next(gn))
		    if (gnode_int32(gn) == n)
			break;
		if (gn != NULL)
                    E_FATAL("'%s': Duplicate dimension ending @pos %d\n",
                            str, strp - str);

                dimlist = glist_add_int32(dimlist, n);
            }

            if ((*strp == '\0') || (*strp == '/'))
                break;

            if (*strp != ',')
                E_FATAL("'%s': Bad delimiter @pos %d\n", str, strp - str);

            strp++;
        }

        veclist = glist_add_ptr(veclist, (void *) dimlist);

        if (*strp == '\0')
            break;

        assert(*strp == '/');
        strp++;
    }

    /* Convert the glists to arrays; remember the glists are in reverse order of the input! */
    n = glist_count(veclist);   /* #Subvectors */
    subvec = (int32 **) ckd_calloc(n + 1, sizeof(int32 *));     /* +1 for sentinel */
    subvec[n] = NULL;           /* sentinel */

    for (--n, gn = veclist; (n >= 0) && gn; gn = gnode_next(gn), --n) {
        gn2 = (glist_t) gnode_ptr(gn);

        n2 = glist_count(gn2);  /* Length of this subvector */
        if (n2 <= 0)
            E_FATAL("'%s': 0-length subvector\n", str);

        subvec[n] = (int32 *) ckd_calloc(n2 + 1, sizeof(int32));        /* +1 for sentinel */
        subvec[n][n2] = -1;     /* sentinel */

        for (--n2; (n2 >= 0) && gn2; gn2 = gnode_next(gn2), --n2)
            subvec[n][n2] = gnode_int32(gn2);
        assert((n2 < 0) && (!gn2));
    }
    assert((n < 0) && (!gn));

    /* Free the glists */
    for (gn = veclist; gn; gn = gnode_next(gn)) {
        gn2 = (glist_t) gnode_ptr(gn);
        glist_free(gn2);
    }
    glist_free(veclist);

    return subvec;
}